

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void GetEntropyUnrefinedHelper
               (uint32_t val,int i,uint32_t *val_prev,int *i_prev,VP8LBitEntropy *bit_entropy,
               VP8LStreaks *stats)

{
  int *piVar1;
  uint32_t uVar2;
  uint uVar3;
  uint64_t uVar4;
  int iVar5;
  
  uVar2 = *i_prev;
  iVar5 = i - uVar2;
  uVar3 = *val_prev;
  if ((ulong)uVar3 != 0) {
    bit_entropy->sum = bit_entropy->sum + uVar3 * iVar5;
    bit_entropy->nonzeros = bit_entropy->nonzeros + iVar5;
    bit_entropy->nonzero_code = uVar2;
    if (uVar3 < 0x100) {
      uVar4 = kSLog2Table[uVar3];
    }
    else {
      uVar4 = (*VP8LFastSLog2Slow)(uVar3);
    }
    bit_entropy->entropy = bit_entropy->entropy + (long)iVar5 * uVar4;
    if (bit_entropy->max_val < uVar3) {
      bit_entropy->max_val = uVar3;
    }
  }
  stats->counts[uVar3 != 0] = stats->counts[uVar3 != 0] + (uint)(3 < iVar5);
  piVar1 = stats->streaks[uVar3 != 0] + (3 < iVar5);
  *piVar1 = *piVar1 + iVar5;
  *val_prev = val;
  *i_prev = i;
  return;
}

Assistant:

static WEBP_INLINE void GetEntropyUnrefinedHelper(
    uint32_t val, int i, uint32_t* WEBP_RESTRICT const val_prev,
    int* WEBP_RESTRICT const i_prev,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  const int streak = i - *i_prev;

  // Gather info for the bit entropy.
  if (*val_prev != 0) {
    bit_entropy->sum += (*val_prev) * streak;
    bit_entropy->nonzeros += streak;
    bit_entropy->nonzero_code = *i_prev;
    bit_entropy->entropy += VP8LFastSLog2(*val_prev) * streak;
    if (bit_entropy->max_val < *val_prev) {
      bit_entropy->max_val = *val_prev;
    }
  }

  // Gather info for the Huffman cost.
  stats->counts[*val_prev != 0] += (streak > 3);
  stats->streaks[*val_prev != 0][(streak > 3)] += streak;

  *val_prev = val;
  *i_prev = i;
}